

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

FaceData * __thiscall Ptex::v2_4::PtexReader::errorData(PtexReader *this,bool deleteOnRelease)

{
  FaceData *pFVar1;
  void *in_RDI;
  ErrorFace *in_stack_ffffffffffffffe0;
  
  pFVar1 = (FaceData *)operator_new(0x20);
  std::vector<char,_std::allocator<char>_>::operator[]
            ((vector<char,_std::allocator<char>_> *)((long)in_RDI + 0x220),0);
  ErrorFace::ErrorFace
            (in_stack_ffffffffffffffe0,in_RDI,(int)((ulong)pFVar1 >> 0x20),
             SUB81((ulong)pFVar1 >> 0x18,0));
  return pFVar1;
}

Assistant:

FaceData* errorData(bool deleteOnRelease=false)
    {
        return new ErrorFace(&_errorPixel[0], _pixelsize, deleteOnRelease);
    }